

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>::advance
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *this,HalfCycles duration
          )

{
  bool bVar1;
  uint uVar2;
  Video<(Sinclair::ZXSpectrum::Video::Timing)2> *this_00;
  IntType IVar3;
  pointer this_01;
  bool local_71;
  Cycles local_48;
  HalfCycles local_40;
  HalfCycles local_38;
  Cycles local_30;
  WrappedInt<HalfCycles> local_28;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *local_20;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *local_18;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *this_local;
  HalfCycles duration_local;
  
  local_18 = this;
  this_local = (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *)
               duration.super_WrappedInt<HalfCycles>.length_;
  WrappedInt<HalfCycles>::operator+=
            (&(this->time_since_audio_update_).super_WrappedInt<HalfCycles>,
             (HalfCycles *)&this_local);
  local_20 = this_local;
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
  ::operator+=(&this->video_,(HalfCycles)this_local);
  bVar1 = JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
          ::did_flush(&this->video_);
  if (bVar1) {
    this_00 = JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
              ::last_valid(&this->video_);
    bVar1 = ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>::get_interrupt_line
                      (this_00);
    local_28.length_ =
         (IntType)JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
                  ::last_sequence_point_overrun(&this->video_);
    CPU::Z80::ProcessorBase::set_interrupt_line
              (&(this->z80_).super_ProcessorBase,bVar1,(HalfCycles)local_28.length_);
  }
  if ((this->tape_player_is_sleeping_ & 1U) == 0) {
    IVar3 = WrappedInt<HalfCycles>::as_integral((WrappedInt<HalfCycles> *)&this_local);
    Cycles::Cycles(&local_30,IVar3);
    Storage::Tape::BinaryTapePlayer::run_for(&this->tape_player_,local_30);
  }
  local_71 = false;
  if ((this->use_automatic_tape_motor_control_ & 1U) != 0) {
    uVar2 = clock_rate();
    HalfCycles::HalfCycles(&local_38,(ulong)uVar2);
    local_71 = WrappedInt<HalfCycles>::operator<
                         (&(this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>,
                          &local_38);
  }
  if (local_71 != false) {
    WrappedInt<HalfCycles>::operator+=
              (&(this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>,
               (HalfCycles *)&this_local);
    uVar2 = clock_rate();
    HalfCycles::HalfCycles(&local_40,(ulong)uVar2);
    bVar1 = WrappedInt<HalfCycles>::operator>=
                      (&(this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>,&local_40
                      );
    if (bVar1) {
      Storage::Tape::BinaryTapePlayer::set_motor_control(&this->tape_player_,false);
      this->recent_tape_hits_ = 0;
    }
  }
  IVar3 = WrappedInt<HalfCycles>::as_integral((WrappedInt<HalfCycles> *)&this_local);
  Cycles::Cycles(&local_48,IVar3);
  JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::operator+=(&this->fdc_,local_48);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)
                     &(this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).typer_);
  if (bVar1) {
    this_01 = std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::operator->
                        (&(this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).
                          typer_);
    Utility::Typer::run_for(this_01,(HalfCycles)this_local);
  }
  return;
}

Assistant:

void advance(HalfCycles duration) {
			time_since_audio_update_ += duration;

			video_ += duration;
			if(video_.did_flush()) {
				z80_.set_interrupt_line(video_.last_valid()->get_interrupt_line(), video_.last_sequence_point_overrun());
			}

			if(!tape_player_is_sleeping_) tape_player_.run_for(duration.as_integral());

			// Update automatic tape motor control, if enabled; if it's been
			// 0.5 seconds since software last possibly polled the tape, stop it.
			if(use_automatic_tape_motor_control_ && cycles_since_tape_input_read_ < HalfCycles(clock_rate())) {
				cycles_since_tape_input_read_ += duration;

				if(cycles_since_tape_input_read_ >= HalfCycles(clock_rate())) {
					tape_player_.set_motor_control(false);
					recent_tape_hits_ = 0;
				}
			}

			if constexpr (model == Model::Plus3) {
				fdc_ += Cycles(duration.as_integral());
			}

			if(typer_) typer_->run_for(duration);
		}